

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O3

void __thiscall LongReadsMapper::write_read_paths(LongReadsMapper *this,string *filename)

{
  pointer pvVar1;
  vector<long,_std::allocator<long>_> *v;
  pointer pvVar2;
  uint64_t count;
  ofstream ofs;
  long local_230;
  long local_228;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220,(string *)filename,_S_bin);
  local_228 = ((long)(this->read_paths).
                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->read_paths).
                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  std::ostream::write((char *)&local_220,(long)&local_228);
  if (local_228 != 0) {
    pvVar2 = (this->read_paths).
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar1 = (this->read_paths).
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar2 != pvVar1) {
      do {
        local_230 = (long)(pvVar2->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(pvVar2->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 3;
        std::ostream::write((char *)&local_220,(long)&local_230);
        if (local_230 != 0) {
          std::ostream::write((char *)&local_220,
                              (long)(pvVar2->super__Vector_base<long,_std::allocator<long>_>).
                                    _M_impl.super__Vector_impl_data._M_start);
        }
        pvVar2 = pvVar2 + 1;
      } while (pvVar2 != pvVar1);
    }
  }
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _setbuf;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void LongReadsMapper::write_read_paths(std::string filename) {
    std::ofstream ofs(filename, std::ios_base::binary);
    sdglib::write_flat_vectorvector(ofs, read_paths);
}